

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O2

void __thiscall soul::Compiler::addDefaultBuiltInLibrary(Compiler *this)

{
  RefCountedPtr<soul::SourceCodeText> local_130;
  string_view in_stack_fffffffffffffed8;
  CodeLocation local_110;
  CodeLocation local_100;
  CodeLocation local_f0;
  CodeLocation local_e0;
  CodeLocation local_d0;
  CodeLocation local_c0;
  CodeLocation local_b0;
  CodeLocation local_a0;
  CompileMessageHandler handler;
  CompileMessageList list;
  
  list.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.onMessage.super__Function_base._M_manager = (_Manager_type)0x0;
  list.onMessage._M_invoker = (_Invoker_type)0x0;
  list.onMessage.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  list.onMessage.super__Function_base._M_functor._8_8_ = 0;
  list.messages.super__Vector_base<soul::CompileMessage,_std::allocator<soul::CompileMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CompileMessageHandler::CompileMessageHandler(&handler,&list);
  getDefaultLibraryCode();
  compile(this,&local_a0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_a0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_b0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_b0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_c0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_c0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_d0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_d0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_e0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_e0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_f0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_f0.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_100);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_100.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,&local_110);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_110.sourceCode);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,(CodeLocation *)&stack0xfffffffffffffee0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&stack0xfffffffffffffee0);
  getSystemModule(in_stack_fffffffffffffed8);
  compile(this,(CodeLocation *)&local_130);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_130);
  CompileMessageHandler::~CompileMessageHandler(&handler);
  CompileMessageList::~CompileMessageList(&list);
  return;
}

Assistant:

void Compiler::addDefaultBuiltInLibrary()
{
    CompileMessageList list;

    try
    {
        soul::CompileMessageHandler handler (list);
        compile (getDefaultLibraryCode());

        // TODO: when we have import & module support, these will no longer be hard-coded here
        compile (getSystemModule ("soul.audio.utils"));
        compile (getSystemModule ("soul.midi"));
        compile (getSystemModule ("soul.notes"));
        compile (getSystemModule ("soul.frequency"));
        compile (getSystemModule ("soul.mixing"));
        compile (getSystemModule ("soul.oscillators"));
        compile (getSystemModule ("soul.noise"));
        compile (getSystemModule ("soul.timeline"));
        compile (getSystemModule ("soul.filters"));
    }
    catch (soul::AbortCompilationException)
    {
        soul::throwInternalCompilerError ("Error in built-in code: " + list.toString());
    }
}